

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O2

LY_ERR lyd_diff_reverse_remove_op_r(lyd_node *diff,lyd_diff_op op)

{
  lyd_diff_op lVar1;
  LY_ERR extraout_EAX;
  lyd_node_inner *in_RAX;
  lyd_meta *meta;
  char *str;
  lyd_node_inner *node;
  lys_module *plVar2;
  lyd_node_inner *plVar3;
  
  plVar3 = (lyd_node_inner *)diff;
  do {
    node = plVar3;
    if (node == (lyd_node_inner *)0x0) {
LAB_00118a67:
      return (LY_ERR)in_RAX;
    }
    meta = lyd_find_meta((node->field_0).node.meta,(lys_module *)0x0,"yang:operation");
    if (meta != (lyd_meta *)0x0) {
      str = lyd_get_meta_value(meta);
      lVar1 = lyd_diff_str2op(str);
      if (lVar1 != op) {
        if (diff->schema == (lysc_node *)0x0) {
          plVar2 = (lys_module *)&diff[2].schema;
        }
        else {
          plVar2 = diff->schema->module;
        }
        ly_log(plVar2->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",0x8b5
              );
        return extraout_EAX;
      }
      lyd_free_meta_single(meta);
    }
    in_RAX = (lyd_node_inner *)lyd_child((lyd_node *)node);
    plVar3 = in_RAX;
    if (in_RAX == (lyd_node_inner *)0x0) {
      if (node != (lyd_node_inner *)diff) goto LAB_00118a4e;
      goto LAB_00118a67;
    }
    while (plVar3 == (lyd_node_inner *)0x0) {
      node = (node->field_0).node.parent;
      in_RAX = (node->field_0).node.parent;
      if (in_RAX == diff->parent) break;
LAB_00118a4e:
      plVar3 = (lyd_node_inner *)(node->field_0).node.next;
    }
  } while( true );
}

Assistant:

static LY_ERR
lyd_diff_reverse_remove_op_r(struct lyd_node *diff, enum lyd_diff_op op)
{
    struct lyd_node *elem;
    struct lyd_meta *meta;

    LYD_TREE_DFS_BEGIN(diff, elem) {
        meta = lyd_find_meta(elem->meta, NULL, "yang:operation");
        if (meta) {
            LY_CHECK_ERR_RET(lyd_diff_str2op(lyd_get_meta_value(meta)) != op, LOGINT(LYD_CTX(diff)), LY_EINT);
            lyd_free_meta_single(meta);
        }

        LYD_TREE_DFS_END(diff, elem);
    }

    return LY_SUCCESS;
}